

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
Chainstate::ConnectBlock
          (Chainstate *this,CBlock *block,BlockValidationState *state,CBlockIndex *pindex,
          CCoinsViewCache *view,bool fJustCheck)

{
  int64_t *piVar1;
  duration *pdVar2;
  long lVar3;
  pointer ptVar4;
  pointer ptVar5;
  CChainParams *consensusParams;
  Notifications *notifications;
  BlockManager *pBVar6;
  pointer psVar7;
  element_type *peVar8;
  CTransaction *this_00;
  pointer pCVar9;
  pointer pCVar10;
  pointer pCVar11;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  bool bVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  uint flags;
  long lVar17;
  base_blob<256U> *this_01;
  uint256 *__k;
  iterator iVar18;
  CBlockIndex *pCVar19;
  base_uint<256U> *b;
  int64_t iVar20;
  long lVar21;
  Coin *pCVar22;
  Logger *pLVar23;
  long lVar24;
  long lVar25;
  CAmount CVar26;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> *pvChecks;
  string *txundo;
  size_t j;
  ulong uVar27;
  ulong uVar28;
  ValidationState<BlockValidationResult> *this_02;
  CCheckQueue<CScriptCheck> *pqueueIn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  undefined7 in_register_00000089;
  char *args_2;
  uint uVar29;
  pointer psVar30;
  CBlock *pCVar31;
  long in_FS_OFFSET;
  double dVar32;
  undefined1 auVar33 [16];
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  string_view source_file_11;
  string_view source_file_12;
  string_view source_file_13;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  string_view logging_function_11;
  string_view logging_function_12;
  string_view logging_function_13;
  double *pdVar34;
  Level in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  undefined7 in_stack_fffffffffffffd60;
  char cVar35;
  ValidationState<BlockValidationResult> *this_03;
  long local_268;
  ulong local_258;
  int local_250;
  double local_230;
  int local_224;
  CAmount txfee;
  vector<int,_std::allocator<int>_> prevheights;
  vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_> txsdata;
  CBlockUndo blockundo;
  CBlockIndex *pindex_local;
  CCheckQueueControl<CScriptCheck> control;
  string local_1a8;
  string local_188;
  string log_msg;
  undefined1 local_140 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  base_blob<256U> local_118;
  uint256 block_hash;
  CAmount blockReward;
  allocator<char> local_b8 [32];
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> vChecks;
  string local_78;
  string log_msg_1;
  
  args_2 = (char *)CONCAT71(in_register_00000089,fJustCheck);
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pindex_local = pindex;
  if (pindex == (CBlockIndex *)0x0) {
    __assert_fail("pindex",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x96a,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  CBlockHeader::GetHash((uint256 *)&block_hash.super_base_blob<256U>,&block->super_CBlockHeader);
  bVar12 = ::operator==(&pindex->phashBlock->super_base_blob<256U>,&block_hash.super_base_blob<256U>
                       );
  if (!bVar12) {
    __assert_fail("*pindex->phashBlock == block_hash",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x96d,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  ptVar4 = (this->m_chainman->m_script_check_queue).m_worker_threads.
           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar5 = (this->m_chainman->m_script_check_queue).m_worker_threads.
           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar17 = std::chrono::_V2::steady_clock::now();
  consensusParams = (this->m_chainman->m_options).chainparams;
  bVar12 = !fJustCheck;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)bVar12;
  this_02 = &state->super_ValidationState<BlockValidationResult>;
  bVar12 = CheckBlock(block,state,&consensusParams->consensus,bVar12,bVar12);
  if (!bVar12) {
    if ((state->super_ValidationState<BlockValidationResult>).m_result == BLOCK_MUTATED) {
      notifications = (this->m_chainman->m_options).notifications;
      _((bilingual_str *)&log_msg,(ConstevalStringLiteral)0x6d7f50);
      bVar13 = FatalError(notifications,state,(bilingual_str *)&log_msg);
      bilingual_str::~bilingual_str((bilingual_str *)&log_msg);
    }
    else {
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                ((string *)&blockReward,&state->super_ValidationState<BlockValidationResult>);
      pLVar23 = LogInstance();
      bVar12 = BCLog::Logger::Enabled(pLVar23);
      if (bVar12) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_allocated_capacity =
             log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
        tinyformat::format<char[13],std::__cxx11::string>
                  (&log_msg_1,(tinyformat *)"%s: Consensus::CheckBlock: %s\n","ConnectBlock",
                   (char (*) [13])&blockReward,args_1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&log_msg_1);
        std::__cxx11::string::~string((string *)&log_msg_1);
        pLVar23 = LogInstance();
        log_msg_1._M_dataplus._M_p = (pointer)0x57;
        log_msg_1._M_string_length = (size_type)anon_var_dwarf_bf6ded;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x57;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "ConnectBlock";
        logging_function._M_len = 0xc;
        BCLog::Logger::LogPrintStr(pLVar23,str,logging_function,source_file,0x987,ALL,Error);
        std::__cxx11::string::~string((string *)&log_msg);
      }
      std::__cxx11::string::~string((string *)&blockReward);
      bVar13 = 0;
    }
    goto LAB_00361bab;
  }
  if (pindex->pprev == (CBlockIndex *)0x0) {
    local_118.m_data._M_elems[0x10] = '\0';
    local_118.m_data._M_elems[0x11] = '\0';
    local_118.m_data._M_elems[0x12] = '\0';
    local_118.m_data._M_elems[0x13] = '\0';
    local_118.m_data._M_elems[0x14] = '\0';
    local_118.m_data._M_elems[0x15] = '\0';
    local_118.m_data._M_elems[0x16] = '\0';
    local_118.m_data._M_elems[0x17] = '\0';
    local_118.m_data._M_elems[0x18] = '\0';
    local_118.m_data._M_elems[0x19] = '\0';
    local_118.m_data._M_elems[0x1a] = '\0';
    local_118.m_data._M_elems[0x1b] = '\0';
    local_118.m_data._M_elems[0x1c] = '\0';
    local_118.m_data._M_elems[0x1d] = '\0';
    local_118.m_data._M_elems[0x1e] = '\0';
    local_118.m_data._M_elems[0x1f] = '\0';
    local_118.m_data._M_elems[0] = '\0';
    local_118.m_data._M_elems[1] = '\0';
    local_118.m_data._M_elems[2] = '\0';
    local_118.m_data._M_elems[3] = '\0';
    local_118.m_data._M_elems[4] = '\0';
    local_118.m_data._M_elems[5] = '\0';
    local_118.m_data._M_elems[6] = '\0';
    local_118.m_data._M_elems[7] = '\0';
    local_118.m_data._M_elems[8] = '\0';
    local_118.m_data._M_elems[9] = '\0';
    local_118.m_data._M_elems[10] = '\0';
    local_118.m_data._M_elems[0xb] = '\0';
    local_118.m_data._M_elems[0xc] = '\0';
    local_118.m_data._M_elems[0xd] = '\0';
    local_118.m_data._M_elems[0xe] = '\0';
    local_118.m_data._M_elems[0xf] = '\0';
  }
  else {
    CBlockIndex::GetBlockHash((uint256 *)&local_118,pindex->pprev);
  }
  (*(view->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&log_msg,view);
  bVar12 = ::operator==(&local_118,(base_blob<256U> *)&log_msg);
  if (!bVar12) {
    __assert_fail("hashPrevBlock == view.GetBestBlock()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x98d,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  piVar1 = &this->m_chainman->num_blocks_total;
  *piVar1 = *piVar1 + 1;
  bVar12 = ::operator==(&block_hash.super_base_blob<256U>,(base_blob<256U> *)consensusParams);
  if (bVar12) {
    bVar13 = 1;
    if (!fJustCheck) {
      CBlockIndex::GetBlockHash((uint256 *)&log_msg,pindex);
      CCoinsViewCache::SetBestBlock(view,(uint256 *)&log_msg);
    }
    goto LAB_00361bab;
  }
  this_01 = &ChainstateManager::AssumedValidBlock(this->m_chainman)->super_base_blob<256U>;
  bVar12 = base_blob<256U>::IsNull(this_01);
  cVar35 = '\x01';
  if (!bVar12) {
    pBVar6 = this->m_blockman;
    __k = ChainstateManager::AssumedValidBlock(this->m_chainman);
    iVar18 = std::
             _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(pBVar6->m_block_index)._M_h,__k);
    if (iVar18.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur !=
        (__node_type *)0x0) {
      pCVar19 = CBlockIndex::GetAncestor
                          ((CBlockIndex *)
                           ((long)iVar18.
                                  super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>
                                  ._M_cur + 0x28),pindex->nHeight);
      if (pCVar19 == pindex) {
        pCVar19 = CBlockIndex::GetAncestor(this->m_chainman->m_best_header,pindex->nHeight);
        if (pCVar19 == pindex) {
          pCVar19 = this->m_chainman->m_best_header;
          b = &ChainstateManager::MinimumChainWork(this->m_chainman)->super_base_uint<256U>;
          bVar12 = operator>=(&(pCVar19->nChainWork).super_base_uint<256U>,b);
          if (bVar12) {
            pCVar19 = this->m_chainman->m_best_header;
            iVar20 = GetBlockProofEquivalentTime(pCVar19,pindex,pCVar19,&consensusParams->consensus)
            ;
            cVar35 = iVar20 < 0x127501;
          }
        }
      }
    }
  }
  lVar21 = std::chrono::_V2::steady_clock::now();
  pdVar2 = &this->m_chainman->time_check;
  pdVar2->__r = pdVar2->__r + (lVar21 - lVar17);
  pdVar34 = (double *)0x3607c0;
  bVar12 = ::LogAcceptCategory(BENCH,Debug);
  if (bVar12) {
    log_msg._M_dataplus._M_p = (pointer)((double)(lVar21 - lVar17) / 1000000.0);
    dVar32 = (double)(this->m_chainman->time_check).__r;
    log_msg_1._M_dataplus._M_p = (pointer)(dVar32 / 1000000000.0);
    local_78._M_dataplus._M_p =
         (pointer)((dVar32 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
    args_2 = "    - Sanity checks: %.2fms [%.2fs (%.2fms/blk)]\n";
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file_03._M_len = 0x57;
    logging_function_03._M_str = "ConnectBlock";
    logging_function_03._M_len = 0xc;
    LogPrintf_<double,double,double>
              (logging_function_03,source_file_03,0x9bd,
               I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PRUNE|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ADDRMAN
               |ESTIMATEFEE|RPC|WALLETDB|BENCH|HTTP|MEMPOOL,(Level)&log_msg,(char *)&log_msg_1,
               (double *)&local_78,pdVar34,
               (double *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  }
  bVar12 = IsBIP30Repeat(pindex);
  if (pindex->pprev == (CBlockIndex *)0x0) {
    __assert_fail("pindex->pprev",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0xa02,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  pCVar19 = CBlockIndex::GetAncestor(pindex->pprev,(consensusParams->consensus).BIP34Height);
  if (bVar12) {
LAB_003608c0:
    if (0x1e44d5 < pindex->nHeight) goto LAB_003608ce;
  }
  else {
    if (pCVar19 != (CBlockIndex *)0x0) {
      CBlockIndex::GetBlockHash((uint256 *)&log_msg,pCVar19);
      bVar12 = ::operator==((base_blob<256U> *)&log_msg,
                            &(consensusParams->consensus).BIP34Hash.super_base_blob<256U>);
      if (bVar12) goto LAB_003608c0;
    }
LAB_003608ce:
    psVar7 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar30 = (block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar30 != psVar7;
        psVar30 = psVar30 + 1) {
      uVar27 = 0;
      while( true ) {
        peVar8 = (psVar30->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        lVar17 = (long)(peVar8->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(peVar8->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if ((ulong)(lVar17 / 0x28) <= uVar27) break;
        log_msg._M_dataplus._M_p =
             *(pointer *)(peVar8->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        log_msg._M_string_length =
             *(size_type *)((peVar8->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        log_msg.field_2._M_allocated_capacity =
             *(undefined8 *)((peVar8->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        log_msg.field_2._8_8_ =
             *(undefined8 *)((peVar8->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        iVar16 = (*(view->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                           (view,&log_msg,lVar17 % 0x28);
        uVar27 = uVar27 + 1;
        if ((char)iVar16 != '\0') {
          source_file_04._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_04._M_len = 0x57;
          logging_function_04._M_str = "ConnectBlock";
          logging_function_04._M_len = 0xc;
          ::LogPrintf_<>(logging_function_04,source_file_04,0xa0e,ALL,Info,
                         "ERROR: ConnectBlock(): tried to overwrite transaction\n");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&log_msg,"bad-txns-BIP30",(allocator<char> *)&local_78);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&log_msg_1,"",(allocator<char> *)&vChecks);
          bVar13 = ValidationState<BlockValidationResult>::Invalid
                             (this_02,BLOCK_CONSENSUS,&log_msg,&log_msg_1);
          std::__cxx11::string::~string((string *)&log_msg_1);
          std::__cxx11::string::~string((string *)&log_msg);
          goto LAB_00361bab;
        }
      }
    }
  }
  bVar12 = DeploymentActiveAt<Consensus::BuriedDeployment>(pindex,this->m_chainman,DEPLOYMENT_CSV);
  flags = GetBlockScriptFlags(pindex,this->m_chainman);
  lVar17 = std::chrono::_V2::steady_clock::now();
  pdVar2 = &this->m_chainman->time_forks;
  pdVar2->__r = pdVar2->__r + (lVar17 - lVar21);
  pdVar34 = (double *)0x360a46;
  bVar14 = ::LogAcceptCategory(BENCH,Debug);
  if (bVar14) {
    log_msg._M_dataplus._M_p = (pointer)((double)(lVar17 - lVar21) / 1000000.0);
    dVar32 = (double)(this->m_chainman->time_forks).__r;
    log_msg_1._M_dataplus._M_p = (pointer)(dVar32 / 1000000000.0);
    local_78._M_dataplus._M_p =
         (pointer)((dVar32 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
    args_2 = "    - Fork checks: %.2fms [%.2fs (%.2fms/blk)]\n";
    source_file_05._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file_05._M_len = 0x57;
    logging_function_05._M_str = "ConnectBlock";
    logging_function_05._M_len = 0xc;
    LogPrintf_<double,double,double>
              (logging_function_05,source_file_05,0xa23,
               I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|WALLETDB|BENCH|MEMPOOL,(Level)&log_msg,
               (char *)&log_msg_1,(double *)&local_78,pdVar34,
               (double *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  }
  blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pqueueIn = &this->m_chainman->m_script_check_queue;
  if (cVar35 == '\0') {
    pqueueIn = (CCheckQueue<CScriptCheck> *)0x0;
  }
  if (ptVar4 == ptVar5) {
    pqueueIn = (CCheckQueue<CScriptCheck> *)0x0;
  }
  CCheckQueueControl<CScriptCheck>::CCheckQueueControl(&control,pqueueIn);
  std::vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>::vector
            (&txsdata,(long)(block->vtx).
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(block->vtx).
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4,
             (allocator_type *)&log_msg);
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_03 = this_02;
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::reserve
            (&blockundo.vtxundo,
             ((long)(block->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(block->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) - 1);
  pvChecks = (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0;
  if (ptVar4 != ptVar5) {
    pvChecks = &vChecks;
  }
  local_258 = 0;
  uVar29 = 0;
  local_268 = 0;
  iVar16 = 0;
  pCVar31 = block;
  while( true ) {
    uVar27 = (ulong)uVar29;
    psVar30 = (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(block->vtx).
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar30 >> 4) <= uVar27)
    break;
    this_00 = psVar30[uVar27].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    pCVar9 = (this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar10 = (this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar14 = CTransaction::IsCoinBase(this_00);
    if (!bVar14) {
      txfee = 0;
      log_msg._M_dataplus._M_p = (pointer)0x0;
      log_msg._M_string_length = (long)&log_msg.field_2 + 8;
      log_msg.field_2._M_allocated_capacity = 0;
      log_msg.field_2._8_8_ = log_msg.field_2._8_8_ & 0xffffffffffffff00;
      local_140._0_8_ = &local_130;
      local_140._8_8_ = 0;
      local_130._M_local_buf[0] = '\0';
      bVar14 = Consensus::CheckTxInputs
                         (this_00,(TxValidationState *)&log_msg,view,pindex->nHeight,&txfee);
      if (bVar14) {
        local_258 = local_258 + txfee;
        if (local_258 < 0x775f05a074001) {
          std::vector<int,_std::allocator<int>_>::resize
                    (&prevheights,
                     ((long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x68);
          lVar21 = 0;
          uVar28 = 0;
          this_02 = this_03;
          while( true ) {
            pCVar11 = (this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((ulong)(((long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pCVar11) / 0x68) <=
                uVar28) break;
            pCVar22 = CCoinsViewCache::AccessCoin
                                (view,(COutPoint *)
                                      ((pCVar11->prevout).hash.m_wrapped.super_base_blob<256U>.
                                       m_data._M_elems + lVar21));
            prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar28] = *(uint *)&pCVar22->field_0x28 >> 1;
            uVar28 = uVar28 + 1;
            lVar21 = lVar21 + 0x68;
          }
          bVar15 = SequenceLocks(this_00,(uint)bVar12,&prevheights,pindex);
          pCVar31 = (CBlock *)((ulong)pCVar31 & 0xffffffff);
          bVar14 = true;
          if (bVar15) goto LAB_00360fee;
          args_2 = "ERROR: %s: contains a non-BIP68-final transaction\n";
          source_file_07._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_07._M_len = 0x57;
          logging_function_07._M_str = "ConnectBlock";
          logging_function_07._M_len = 0xc;
          LogPrintf_<char[13]>
                    (logging_function_07,source_file_07,0xa54,
                     I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|ESTIMATEFEE|MEMPOOL|NET,
                     in_stack_fffffffffffffd58,(char *)CONCAT17(cVar35,in_stack_fffffffffffffd60),
                     (char (*) [13])this_02);
          this_03 = this_02;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&log_msg_1,"bad-txns-nonfinal",(allocator<char> *)&vChecks);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",local_b8);
          bVar15 = ValidationState<BlockValidationResult>::Invalid
                             (this_02,BLOCK_CONSENSUS,&log_msg_1,&local_78);
        }
        else {
          args_2 = "ERROR: %s: accumulated fee in the block out of range.\n";
          source_file_06._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_06._M_len = 0x57;
          logging_function_06._M_str = "ConnectBlock";
          logging_function_06._M_len = 0xc;
          LogPrintf_<char[13]>
                    (logging_function_06,source_file_06,0xa47,
                     I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|RPC|ZMQ|HTTP|TOR,
                     in_stack_fffffffffffffd58,(char *)CONCAT17(cVar35,in_stack_fffffffffffffd60),
                     (char (*) [13])this_03);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&log_msg_1,"bad-txns-accumulated-fee-outofrange",
                     (allocator<char> *)&vChecks);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",local_b8);
          bVar15 = ValidationState<BlockValidationResult>::Invalid
                             (this_02,BLOCK_CONSENSUS,&log_msg_1,&local_78);
        }
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&log_msg_1);
        bVar14 = false;
        pCVar31 = (CBlock *)(ulong)bVar15;
        this_02 = this_03;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&log_msg_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &log_msg._M_string_length);
        std::__cxx11::string::string
                  ((string *)&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
        ValidationState<BlockValidationResult>::Invalid
                  (this_02,BLOCK_CONSENSUS,&log_msg_1,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&log_msg_1);
        base_blob<256u>::ToString_abi_cxx11_(&local_188,(base_blob<256u> *)&this_00->hash);
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_(&local_1a8,this_02);
        pLVar23 = LogInstance();
        bVar14 = BCLog::Logger::Enabled(pLVar23);
        this_02 = this_03;
        if (bVar14) {
          log_msg_1._M_dataplus._M_p = (pointer)&log_msg_1.field_2;
          log_msg_1._M_string_length = 0;
          log_msg_1.field_2._M_local_buf[0] = '\0';
          tinyformat::format<char[13],std::__cxx11::string,std::__cxx11::string>
                    (&local_78,(tinyformat *)"%s: Consensus::CheckTxInputs: %s, %s\n","ConnectBlock"
                     ,(char (*) [13])&local_188,&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&log_msg_1,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          pLVar23 = LogInstance();
          local_78._M_dataplus._M_p = (pointer)0x57;
          local_78._M_string_length = 0x6d76f9;
          args_2 = (char *)0xa42;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_00._M_len = 0x57;
          str_00._M_str = log_msg_1._M_dataplus._M_p;
          str_00._M_len = log_msg_1._M_string_length;
          logging_function_00._M_str = "ConnectBlock";
          logging_function_00._M_len = 0xc;
          BCLog::Logger::LogPrintStr
                    (pLVar23,str_00,logging_function_00,source_file_00,0xa42,ALL,Error);
          std::__cxx11::string::~string((string *)&log_msg_1);
          this_02 = this_03;
        }
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_188);
        bVar14 = false;
        pCVar31 = (CBlock *)0x0;
      }
LAB_00360fee:
      bVar13 = (byte)pCVar31;
      ValidationState<TxValidationResult>::~ValidationState
                ((ValidationState<TxValidationResult> *)&log_msg);
      this_03 = this_02;
      if (!bVar14) goto LAB_00361b77;
    }
    iVar20 = GetTransactionSigOpCost(this_00,view,flags);
    local_268 = local_268 + iVar20;
    if (80000 < local_268) {
      source_file_10._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file_10._M_len = 0x57;
      logging_function_10._M_str = "ConnectBlock";
      logging_function_10._M_len = 0xc;
      ::LogPrintf_<>(logging_function_10,source_file_10,0xa5f,ALL,Info,
                     "ERROR: ConnectBlock(): too many sigops\n");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg,"bad-blk-sigops",(allocator<char> *)&local_78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg_1,"",(allocator<char> *)&vChecks);
      bVar13 = ValidationState<BlockValidationResult>::Invalid
                         (this_02,BLOCK_CONSENSUS,&log_msg,&log_msg_1);
      goto LAB_00361b5a;
    }
    bVar14 = CTransaction::IsCoinBase(this_00);
    if (!bVar14) {
      vChecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      log_msg._M_dataplus._M_p = (pointer)0x0;
      log_msg._M_string_length = (size_type)(&log_msg.field_2._M_allocated_capacity + 1);
      log_msg.field_2._M_allocated_capacity = 0;
      log_msg.field_2._8_8_ = log_msg.field_2._8_8_ & 0xffffffffffffff00;
      local_140._0_8_ = &local_130;
      local_140._8_8_ = 0;
      vChecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vChecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_130._M_local_buf[0] = '\0';
      this_02 = this_03;
      if (cVar35 == '\0') {
LAB_003610fc:
        bVar14 = true;
        CCheckQueueControl<CScriptCheck>::Add(&control,&vChecks);
      }
      else {
        args_2 = (char *)(ulong)fJustCheck;
        bVar14 = CheckInputScripts(this_00,(TxValidationState *)&log_msg,view,flags,fJustCheck,
                                   fJustCheck,
                                   txsdata.
                                   super__Vector_base<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar27,
                                   &this->m_chainman->m_validation_cache,pvChecks);
        this_02 = this_03;
        if (bVar14) goto LAB_003610fc;
        std::__cxx11::string::string
                  ((string *)&log_msg_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &log_msg._M_string_length);
        std::__cxx11::string::string
                  ((string *)&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
        this_02 = this_03;
        ValidationState<BlockValidationResult>::Invalid
                  (this_03,BLOCK_CONSENSUS,&log_msg_1,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&log_msg_1);
        base_blob<256u>::ToString_abi_cxx11_(&log_msg_1,(base_blob<256u> *)&this_00->hash);
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_(&local_78,this_03);
        args_2 = (char *)0xffffffffffffffff;
        source_file_08._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_08._M_len = 0x57;
        logging_function_08._M_str = "ConnectBlock";
        logging_function_08._M_len = 0xc;
        LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                  (logging_function_08,source_file_08,0xa6d,ALL,Error,
                   "ConnectBlock(): CheckInputScripts on %s failed with %s\n",&log_msg_1,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&log_msg_1);
        bVar14 = false;
        pCVar31 = (CBlock *)0x0;
      }
      bVar13 = (byte)pCVar31;
      ValidationState<TxValidationResult>::~ValidationState
                ((ValidationState<TxValidationResult> *)&log_msg);
      std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector(&vChecks);
      this_03 = this_02;
      if (!bVar14) goto LAB_00361b77;
    }
    log_msg.field_2._M_allocated_capacity = 0;
    log_msg._M_dataplus._M_p = (pointer)0x0;
    log_msg._M_string_length = 0;
    txundo = &log_msg;
    if (uVar27 != 0) {
      std::vector<CTxUndo,_std::allocator<CTxUndo>_>::emplace_back<>(&blockundo.vtxundo);
      txundo = (string *)
               (blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                super__Vector_impl_data._M_finish + -1);
    }
    pindex = pindex_local;
    UpdateCoins(this_00,view,(CTxUndo *)txundo,pindex_local->nHeight);
    local_250 = (int)(((long)pCVar9 - (long)pCVar10) / 0x68);
    iVar16 = iVar16 + local_250;
    std::vector<Coin,_std::allocator<Coin>_>::~vector
              ((vector<Coin,_std::allocator<Coin>_> *)&log_msg);
    uVar29 = uVar29 + 1;
  }
  lVar21 = std::chrono::_V2::steady_clock::now();
  pdVar2 = &this->m_chainman->time_connect;
  pdVar2->__r = pdVar2->__r + (lVar21 - lVar17);
  bVar12 = ::LogAcceptCategory(BENCH,Debug);
  if (bVar12) {
    lVar24 = (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    lVar25 = lVar24 >> 4;
    local_224 = (int)lVar25;
    blockReward = (CAmount)((double)(lVar21 - lVar17) / 1000000.0);
    auVar33._8_4_ = (int)(lVar24 >> 0x24);
    auVar33._0_8_ = lVar25;
    auVar33._12_4_ = 0x45300000;
    local_188._M_dataplus._M_p =
         (pointer)((double)blockReward /
                  ((auVar33._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,local_224) - 4503599627370496.0)));
    local_1a8._M_dataplus._M_p = (pointer)0x0;
    if (1 < iVar16) {
      local_1a8._M_dataplus._M_p = (pointer)((double)blockReward / (double)(iVar16 + -1));
    }
    dVar32 = (double)(this->m_chainman->time_connect).__r;
    txfee = (CAmount)(dVar32 / 1000000000.0);
    local_230 = (dVar32 / 1000000.0) / (double)this->m_chainman->num_blocks_total;
    pLVar23 = LogInstance();
    bVar12 = BCLog::Logger::Enabled(pLVar23);
    if (bVar12) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_allocated_capacity =
           log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
      tinyformat::format<unsigned_int,double,double,double,double,double>
                (&log_msg_1,
                 (tinyformat *)
                 "      - Connect %u transactions: %.2fms (%.3fms/tx, %.3fms/txin) [%.2fs (%.2fms/blk)]\n"
                 ,(char *)&local_224,(uint *)&blockReward,(double *)&local_188,(double *)&local_1a8,
                 (double *)&txfee,&local_230,
                 (double *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&log_msg_1);
      std::__cxx11::string::~string((string *)&log_msg_1);
      pLVar23 = LogInstance();
      log_msg_1._M_dataplus._M_p = (pointer)0x57;
      log_msg_1._M_string_length = (size_type)anon_var_dwarf_bf6ded;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file_01._M_len = 0x57;
      str_01._M_str = log_msg._M_dataplus._M_p;
      str_01._M_len = log_msg._M_string_length;
      logging_function_01._M_str = "ConnectBlock";
      logging_function_01._M_len = 0xc;
      BCLog::Logger::LogPrintStr
                (pLVar23,str_01,logging_function_01,source_file_01,0xa7f,BENCH,Debug);
      std::__cxx11::string::~string((string *)&log_msg);
      pindex = pindex_local;
    }
  }
  lVar21 = (long)pindex->nHeight / (long)(consensusParams->consensus).nSubsidyHalvingInterval;
  uVar27 = 0;
  if ((int)lVar21 < 0x40) {
    uVar27 = 5000000000 >> ((byte)lVar21 & 0x3f);
  }
  blockReward = uVar27 + local_258;
  CVar26 = CTransaction::GetValueOut
                     ((((block->vtx).
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if ((long)(uVar27 + local_258) < CVar26) {
    log_msg._M_dataplus._M_p =
         (pointer)CTransaction::GetValueOut
                            ((((block->vtx).
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
    source_file_09._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file_09._M_len = 0x57;
    logging_function_09._M_str = "ConnectBlock";
    logging_function_09._M_len = 0xc;
    LogPrintf_<long,long>
              (logging_function_09,source_file_09,0xa83,
               I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|ADDRMAN|BENCH,(Level)&log_msg,
               (char *)&blockReward,
               (long *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
               (long *)CONCAT17(cVar35,in_stack_fffffffffffffd60));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"bad-cb-amount",(allocator<char> *)&local_78);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg_1,"",(allocator<char> *)&vChecks);
    bVar13 = ValidationState<BlockValidationResult>::Invalid
                       (this_03,BLOCK_CONSENSUS,&log_msg,&log_msg_1);
LAB_00361b5a:
    std::__cxx11::string::~string((string *)&log_msg_1);
    std::__cxx11::string::~string((string *)&log_msg);
  }
  else {
    bVar12 = CCheckQueueControl<CScriptCheck>::Wait(&control);
    if (!bVar12) {
      source_file_13._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file_13._M_len = 0x57;
      logging_function_13._M_str = "ConnectBlock";
      logging_function_13._M_len = 0xc;
      LogPrintf_<char[13]>
                (logging_function_13,source_file_13,0xa88,
                 I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|ADDRMAN|WALLETDB|ZMQ|MEMPOOL|NET,
                 in_stack_fffffffffffffd58,(char *)CONCAT17(cVar35,in_stack_fffffffffffffd60),
                 (char (*) [13])this_03);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg,"block-validation-failed",(allocator<char> *)&local_78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg_1,"",(allocator<char> *)&vChecks);
      bVar13 = ValidationState<BlockValidationResult>::Invalid
                         (this_03,BLOCK_CONSENSUS,&log_msg,&log_msg_1);
      goto LAB_00361b5a;
    }
    lVar21 = std::chrono::_V2::steady_clock::now();
    pdVar2 = &this->m_chainman->time_verify;
    pdVar2->__r = pdVar2->__r + (lVar21 - lVar17);
    bVar12 = ::LogAcceptCategory(BENCH,Debug);
    if (bVar12) {
      local_224 = iVar16 + -1;
      local_188._M_dataplus._M_p = (pointer)((double)(lVar21 - lVar17) / 1000000.0);
      local_1a8._M_dataplus._M_p = (pointer)0x0;
      if (1 < iVar16) {
        local_1a8._M_dataplus._M_p =
             (pointer)((double)local_188._M_dataplus._M_p / (double)local_224);
      }
      dVar32 = (double)(this->m_chainman->time_verify).__r;
      txfee = (CAmount)(dVar32 / 1000000000.0);
      local_230 = (dVar32 / 1000000.0) / (double)this->m_chainman->num_blocks_total;
      pLVar23 = LogInstance();
      pdVar34 = (double *)0x3617ac;
      bVar12 = BCLog::Logger::Enabled(pLVar23);
      if (bVar12) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_allocated_capacity =
             log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
        tinyformat::format<int,double,double,double,double>
                  (&log_msg_1,
                   (tinyformat *)
                   "    - Verify %u txins: %.2fms (%.3fms/txin) [%.2fs (%.2fms/blk)]\n",
                   (char *)&local_224,(int *)&local_188,(double *)&local_1a8,(double *)&txfee,
                   &local_230,pdVar34);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&log_msg_1);
        std::__cxx11::string::~string((string *)&log_msg_1);
        pLVar23 = LogInstance();
        log_msg_1._M_dataplus._M_p = (pointer)0x57;
        log_msg_1._M_string_length = (size_type)anon_var_dwarf_bf6ded;
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_02._M_len = 0x57;
        str_02._M_str = log_msg._M_dataplus._M_p;
        str_02._M_len = log_msg._M_string_length;
        logging_function_02._M_str = "ConnectBlock";
        logging_function_02._M_len = 0xc;
        BCLog::Logger::LogPrintStr
                  (pLVar23,str_02,logging_function_02,source_file_02,0xa91,BENCH,Debug);
        std::__cxx11::string::~string((string *)&log_msg);
      }
    }
    pCVar19 = pindex_local;
    bVar13 = 1;
    if (!fJustCheck) {
      bVar12 = ::node::BlockManager::WriteUndoDataForBlock
                         (this->m_blockman,&blockundo,(BlockValidationState *)this_03,pindex_local);
      if (bVar12) {
        lVar17 = std::chrono::_V2::steady_clock::now();
        pdVar2 = &this->m_chainman->time_undo;
        pdVar2->__r = pdVar2->__r + (lVar17 - lVar21);
        pdVar34 = (double *)0x361906;
        bVar12 = ::LogAcceptCategory(BENCH,Debug);
        if (bVar12) {
          log_msg._M_dataplus._M_p = (pointer)((double)(lVar17 - lVar21) / 1000000.0);
          dVar32 = (double)(this->m_chainman->time_undo).__r;
          log_msg_1._M_dataplus._M_p = (pointer)(dVar32 / 1000000000.0);
          local_78._M_dataplus._M_p =
               (pointer)((dVar32 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
          source_file_11._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_11._M_len = 0x57;
          logging_function_11._M_str = "ConnectBlock";
          logging_function_11._M_len = 0xc;
          LogPrintf_<double,double,double>
                    (logging_function_11,source_file_11,0xa9f,
                     I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|ADDRMAN|RPC|WALLETDB|BENCH|HTTP|
                     MEMPOOL|NET,(Level)&log_msg,(char *)&log_msg_1,(double *)&local_78,pdVar34,
                     (double *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
        }
        if ((pCVar19->nStatus & 0x60) != 0 || (pCVar19->nStatus & 7) < 5) {
          CBlockIndex::RaiseValidity(pCVar19,BLOCK_VALID_SCRIPTS);
          std::
          _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
          ::_M_insert_unique<CBlockIndex*const&>
                    ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                      *)&this->m_blockman->m_dirty_blockindex,&pindex_local);
          pCVar19 = pindex_local;
        }
        CBlockIndex::GetBlockHash((uint256 *)&log_msg,pCVar19);
        CCoinsViewCache::SetBestBlock(view,(uint256 *)&log_msg);
        lVar21 = std::chrono::_V2::steady_clock::now();
        pdVar2 = &this->m_chainman->time_index;
        pdVar2->__r = pdVar2->__r + (lVar21 - lVar17);
        pdVar34 = (double *)0x361a36;
        bVar12 = ::LogAcceptCategory(BENCH,Debug);
        if (bVar12) {
          log_msg._M_dataplus._M_p = (pointer)((double)(lVar21 - lVar17) / 1000000.0);
          dVar32 = (double)(this->m_chainman->time_index).__r;
          log_msg_1._M_dataplus._M_p = (pointer)(dVar32 / 1000000000.0);
          local_78._M_dataplus._M_p =
               (pointer)((dVar32 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
          source_file_12._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_12._M_len = 0x57;
          logging_function_12._M_str = "ConnectBlock";
          logging_function_12._M_len = 0xc;
          LogPrintf_<double,double,double>
                    (logging_function_12,source_file_12,0xaae,
                     I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|ADDRMAN|ESTIMATEFEE|BENCH|NET,
                     (Level)&log_msg,(char *)&log_msg_1,(double *)&local_78,pdVar34,
                     (double *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
        }
        bVar13 = 1;
      }
      else {
        bVar13 = 0;
      }
    }
  }
LAB_00361b77:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&prevheights.super__Vector_base<int,_std::allocator<int>_>);
  std::vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>::~vector
            (&txsdata);
  CCheckQueueControl<CScriptCheck>::~CCheckQueueControl(&control);
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&blockundo.vtxundo);
LAB_00361bab:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (bool)(bVar13 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::ConnectBlock(const CBlock& block, BlockValidationState& state, CBlockIndex* pindex,
                               CCoinsViewCache& view, bool fJustCheck)
{
    AssertLockHeld(cs_main);
    assert(pindex);

    uint256 block_hash{block.GetHash()};
    assert(*pindex->phashBlock == block_hash);
    const bool parallel_script_checks{m_chainman.GetCheckQueue().HasThreads()};

    const auto time_start{SteadyClock::now()};
    const CChainParams& params{m_chainman.GetParams()};

    // Check it again in case a previous version let a bad block in
    // NOTE: We don't currently (re-)invoke ContextualCheckBlock() or
    // ContextualCheckBlockHeader() here. This means that if we add a new
    // consensus rule that is enforced in one of those two functions, then we
    // may have let in a block that violates the rule prior to updating the
    // software, and we would NOT be enforcing the rule here. Fully solving
    // upgrade from one software version to the next after a consensus rule
    // change is potentially tricky and issue-specific (see NeedsRedownload()
    // for one approach that was used for BIP 141 deployment).
    // Also, currently the rule against blocks more than 2 hours in the future
    // is enforced in ContextualCheckBlockHeader(); we wouldn't want to
    // re-enforce that rule here (at least until we make it impossible for
    // the clock to go backward).
    if (!CheckBlock(block, state, params.GetConsensus(), !fJustCheck, !fJustCheck)) {
        if (state.GetResult() == BlockValidationResult::BLOCK_MUTATED) {
            // We don't write down blocks to disk if they may have been
            // corrupted, so this should be impossible unless we're having hardware
            // problems.
            return FatalError(m_chainman.GetNotifications(), state, _("Corrupt block found indicating potential hardware failure."));
        }
        LogError("%s: Consensus::CheckBlock: %s\n", __func__, state.ToString());
        return false;
    }

    // verify that the view's current state corresponds to the previous block
    uint256 hashPrevBlock = pindex->pprev == nullptr ? uint256() : pindex->pprev->GetBlockHash();
    assert(hashPrevBlock == view.GetBestBlock());

    m_chainman.num_blocks_total++;

    // Special case for the genesis block, skipping connection of its transactions
    // (its coinbase is unspendable)
    if (block_hash == params.GetConsensus().hashGenesisBlock) {
        if (!fJustCheck)
            view.SetBestBlock(pindex->GetBlockHash());
        return true;
    }

    bool fScriptChecks = true;
    if (!m_chainman.AssumedValidBlock().IsNull()) {
        // We've been configured with the hash of a block which has been externally verified to have a valid history.
        // A suitable default value is included with the software and updated from time to time.  Because validity
        //  relative to a piece of software is an objective fact these defaults can be easily reviewed.
        // This setting doesn't force the selection of any particular chain but makes validating some faster by
        //  effectively caching the result of part of the verification.
        BlockMap::const_iterator it{m_blockman.m_block_index.find(m_chainman.AssumedValidBlock())};
        if (it != m_blockman.m_block_index.end()) {
            if (it->second.GetAncestor(pindex->nHeight) == pindex &&
                m_chainman.m_best_header->GetAncestor(pindex->nHeight) == pindex &&
                m_chainman.m_best_header->nChainWork >= m_chainman.MinimumChainWork()) {
                // This block is a member of the assumed verified chain and an ancestor of the best header.
                // Script verification is skipped when connecting blocks under the
                // assumevalid block. Assuming the assumevalid block is valid this
                // is safe because block merkle hashes are still computed and checked,
                // Of course, if an assumed valid block is invalid due to false scriptSigs
                // this optimization would allow an invalid chain to be accepted.
                // The equivalent time check discourages hash power from extorting the network via DOS attack
                //  into accepting an invalid block through telling users they must manually set assumevalid.
                //  Requiring a software change or burying the invalid block, regardless of the setting, makes
                //  it hard to hide the implication of the demand.  This also avoids having release candidates
                //  that are hardly doing any signature verification at all in testing without having to
                //  artificially set the default assumed verified block further back.
                // The test against the minimum chain work prevents the skipping when denied access to any chain at
                //  least as good as the expected chain.
                fScriptChecks = (GetBlockProofEquivalentTime(*m_chainman.m_best_header, *pindex, *m_chainman.m_best_header, params.GetConsensus()) <= 60 * 60 * 24 * 7 * 2);
            }
        }
    }

    const auto time_1{SteadyClock::now()};
    m_chainman.time_check += time_1 - time_start;
    LogDebug(BCLog::BENCH, "    - Sanity checks: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_1 - time_start),
             Ticks<SecondsDouble>(m_chainman.time_check),
             Ticks<MillisecondsDouble>(m_chainman.time_check) / m_chainman.num_blocks_total);

    // Do not allow blocks that contain transactions which 'overwrite' older transactions,
    // unless those are already completely spent.
    // If such overwrites are allowed, coinbases and transactions depending upon those
    // can be duplicated to remove the ability to spend the first instance -- even after
    // being sent to another address.
    // See BIP30, CVE-2012-1909, and http://r6.ca/blog/20120206T005236Z.html for more information.
    // This rule was originally applied to all blocks with a timestamp after March 15, 2012, 0:00 UTC.
    // Now that the whole chain is irreversibly beyond that time it is applied to all blocks except the
    // two in the chain that violate it. This prevents exploiting the issue against nodes during their
    // initial block download.
    bool fEnforceBIP30 = !IsBIP30Repeat(*pindex);

    // Once BIP34 activated it was not possible to create new duplicate coinbases and thus other than starting
    // with the 2 existing duplicate coinbase pairs, not possible to create overwriting txs.  But by the
    // time BIP34 activated, in each of the existing pairs the duplicate coinbase had overwritten the first
    // before the first had been spent.  Since those coinbases are sufficiently buried it's no longer possible to create further
    // duplicate transactions descending from the known pairs either.
    // If we're on the known chain at height greater than where BIP34 activated, we can save the db accesses needed for the BIP30 check.

    // BIP34 requires that a block at height X (block X) has its coinbase
    // scriptSig start with a CScriptNum of X (indicated height X).  The above
    // logic of no longer requiring BIP30 once BIP34 activates is flawed in the
    // case that there is a block X before the BIP34 height of 227,931 which has
    // an indicated height Y where Y is greater than X.  The coinbase for block
    // X would also be a valid coinbase for block Y, which could be a BIP30
    // violation.  An exhaustive search of all mainnet coinbases before the
    // BIP34 height which have an indicated height greater than the block height
    // reveals many occurrences. The 3 lowest indicated heights found are
    // 209,921, 490,897, and 1,983,702 and thus coinbases for blocks at these 3
    // heights would be the first opportunity for BIP30 to be violated.

    // The search reveals a great many blocks which have an indicated height
    // greater than 1,983,702, so we simply remove the optimization to skip
    // BIP30 checking for blocks at height 1,983,702 or higher.  Before we reach
    // that block in another 25 years or so, we should take advantage of a
    // future consensus change to do a new and improved version of BIP34 that
    // will actually prevent ever creating any duplicate coinbases in the
    // future.
    static constexpr int BIP34_IMPLIES_BIP30_LIMIT = 1983702;

    // There is no potential to create a duplicate coinbase at block 209,921
    // because this is still before the BIP34 height and so explicit BIP30
    // checking is still active.

    // The final case is block 176,684 which has an indicated height of
    // 490,897. Unfortunately, this issue was not discovered until about 2 weeks
    // before block 490,897 so there was not much opportunity to address this
    // case other than to carefully analyze it and determine it would not be a
    // problem. Block 490,897 was, in fact, mined with a different coinbase than
    // block 176,684, but it is important to note that even if it hadn't been or
    // is remined on an alternate fork with a duplicate coinbase, we would still
    // not run into a BIP30 violation.  This is because the coinbase for 176,684
    // is spent in block 185,956 in transaction
    // d4f7fbbf92f4a3014a230b2dc70b8058d02eb36ac06b4a0736d9d60eaa9e8781.  This
    // spending transaction can't be duplicated because it also spends coinbase
    // 0328dd85c331237f18e781d692c92de57649529bd5edf1d01036daea32ffde29.  This
    // coinbase has an indicated height of over 4.2 billion, and wouldn't be
    // duplicatable until that height, and it's currently impossible to create a
    // chain that long. Nevertheless we may wish to consider a future soft fork
    // which retroactively prevents block 490,897 from creating a duplicate
    // coinbase. The two historical BIP30 violations often provide a confusing
    // edge case when manipulating the UTXO and it would be simpler not to have
    // another edge case to deal with.

    // testnet3 has no blocks before the BIP34 height with indicated heights
    // post BIP34 before approximately height 486,000,000. After block
    // 1,983,702 testnet3 starts doing unnecessary BIP30 checking again.
    assert(pindex->pprev);
    CBlockIndex* pindexBIP34height = pindex->pprev->GetAncestor(params.GetConsensus().BIP34Height);
    //Only continue to enforce if we're below BIP34 activation height or the block hash at that height doesn't correspond.
    fEnforceBIP30 = fEnforceBIP30 && (!pindexBIP34height || !(pindexBIP34height->GetBlockHash() == params.GetConsensus().BIP34Hash));

    // TODO: Remove BIP30 checking from block height 1,983,702 on, once we have a
    // consensus change that ensures coinbases at those heights cannot
    // duplicate earlier coinbases.
    if (fEnforceBIP30 || pindex->nHeight >= BIP34_IMPLIES_BIP30_LIMIT) {
        for (const auto& tx : block.vtx) {
            for (size_t o = 0; o < tx->vout.size(); o++) {
                if (view.HaveCoin(COutPoint(tx->GetHash(), o))) {
                    LogPrintf("ERROR: ConnectBlock(): tried to overwrite transaction\n");
                    return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-BIP30");
                }
            }
        }
    }

    // Enforce BIP68 (sequence locks)
    int nLockTimeFlags = 0;
    if (DeploymentActiveAt(*pindex, m_chainman, Consensus::DEPLOYMENT_CSV)) {
        nLockTimeFlags |= LOCKTIME_VERIFY_SEQUENCE;
    }

    // Get the script flags for this block
    unsigned int flags{GetBlockScriptFlags(*pindex, m_chainman)};

    const auto time_2{SteadyClock::now()};
    m_chainman.time_forks += time_2 - time_1;
    LogDebug(BCLog::BENCH, "    - Fork checks: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_2 - time_1),
             Ticks<SecondsDouble>(m_chainman.time_forks),
             Ticks<MillisecondsDouble>(m_chainman.time_forks) / m_chainman.num_blocks_total);

    CBlockUndo blockundo;

    // Precomputed transaction data pointers must not be invalidated
    // until after `control` has run the script checks (potentially
    // in multiple threads). Preallocate the vector size so a new allocation
    // doesn't invalidate pointers into the vector, and keep txsdata in scope
    // for as long as `control`.
    CCheckQueueControl<CScriptCheck> control(fScriptChecks && parallel_script_checks ? &m_chainman.GetCheckQueue() : nullptr);
    std::vector<PrecomputedTransactionData> txsdata(block.vtx.size());

    std::vector<int> prevheights;
    CAmount nFees = 0;
    int nInputs = 0;
    int64_t nSigOpsCost = 0;
    blockundo.vtxundo.reserve(block.vtx.size() - 1);
    for (unsigned int i = 0; i < block.vtx.size(); i++)
    {
        const CTransaction &tx = *(block.vtx[i]);

        nInputs += tx.vin.size();

        if (!tx.IsCoinBase())
        {
            CAmount txfee = 0;
            TxValidationState tx_state;
            if (!Consensus::CheckTxInputs(tx, tx_state, view, pindex->nHeight, txfee)) {
                // Any transaction validation failure in ConnectBlock is a block consensus failure
                state.Invalid(BlockValidationResult::BLOCK_CONSENSUS,
                            tx_state.GetRejectReason(), tx_state.GetDebugMessage());
                LogError("%s: Consensus::CheckTxInputs: %s, %s\n", __func__, tx.GetHash().ToString(), state.ToString());
                return false;
            }
            nFees += txfee;
            if (!MoneyRange(nFees)) {
                LogPrintf("ERROR: %s: accumulated fee in the block out of range.\n", __func__);
                return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-accumulated-fee-outofrange");
            }

            // Check that transaction is BIP68 final
            // BIP68 lock checks (as opposed to nLockTime checks) must
            // be in ConnectBlock because they require the UTXO set
            prevheights.resize(tx.vin.size());
            for (size_t j = 0; j < tx.vin.size(); j++) {
                prevheights[j] = view.AccessCoin(tx.vin[j].prevout).nHeight;
            }

            if (!SequenceLocks(tx, nLockTimeFlags, prevheights, *pindex)) {
                LogPrintf("ERROR: %s: contains a non-BIP68-final transaction\n", __func__);
                return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-nonfinal");
            }
        }

        // GetTransactionSigOpCost counts 3 types of sigops:
        // * legacy (always)
        // * p2sh (when P2SH enabled in flags and excludes coinbase)
        // * witness (when witness enabled in flags and excludes coinbase)
        nSigOpsCost += GetTransactionSigOpCost(tx, view, flags);
        if (nSigOpsCost > MAX_BLOCK_SIGOPS_COST) {
            LogPrintf("ERROR: ConnectBlock(): too many sigops\n");
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-blk-sigops");
        }

        if (!tx.IsCoinBase())
        {
            std::vector<CScriptCheck> vChecks;
            bool fCacheResults = fJustCheck; /* Don't cache results if we're actually connecting blocks (still consult the cache, though) */
            TxValidationState tx_state;
            if (fScriptChecks && !CheckInputScripts(tx, tx_state, view, flags, fCacheResults, fCacheResults, txsdata[i], m_chainman.m_validation_cache, parallel_script_checks ? &vChecks : nullptr)) {
                // Any transaction validation failure in ConnectBlock is a block consensus failure
                state.Invalid(BlockValidationResult::BLOCK_CONSENSUS,
                              tx_state.GetRejectReason(), tx_state.GetDebugMessage());
                LogError("ConnectBlock(): CheckInputScripts on %s failed with %s\n",
                    tx.GetHash().ToString(), state.ToString());
                return false;
            }
            control.Add(std::move(vChecks));
        }

        CTxUndo undoDummy;
        if (i > 0) {
            blockundo.vtxundo.emplace_back();
        }
        UpdateCoins(tx, view, i == 0 ? undoDummy : blockundo.vtxundo.back(), pindex->nHeight);
    }
    const auto time_3{SteadyClock::now()};
    m_chainman.time_connect += time_3 - time_2;
    LogDebug(BCLog::BENCH, "      - Connect %u transactions: %.2fms (%.3fms/tx, %.3fms/txin) [%.2fs (%.2fms/blk)]\n", (unsigned)block.vtx.size(),
             Ticks<MillisecondsDouble>(time_3 - time_2), Ticks<MillisecondsDouble>(time_3 - time_2) / block.vtx.size(),
             nInputs <= 1 ? 0 : Ticks<MillisecondsDouble>(time_3 - time_2) / (nInputs - 1),
             Ticks<SecondsDouble>(m_chainman.time_connect),
             Ticks<MillisecondsDouble>(m_chainman.time_connect) / m_chainman.num_blocks_total);

    CAmount blockReward = nFees + GetBlockSubsidy(pindex->nHeight, params.GetConsensus());
    if (block.vtx[0]->GetValueOut() > blockReward) {
        LogPrintf("ERROR: ConnectBlock(): coinbase pays too much (actual=%d vs limit=%d)\n", block.vtx[0]->GetValueOut(), blockReward);
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-cb-amount");
    }

    if (!control.Wait()) {
        LogPrintf("ERROR: %s: CheckQueue failed\n", __func__);
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "block-validation-failed");
    }
    const auto time_4{SteadyClock::now()};
    m_chainman.time_verify += time_4 - time_2;
    LogDebug(BCLog::BENCH, "    - Verify %u txins: %.2fms (%.3fms/txin) [%.2fs (%.2fms/blk)]\n", nInputs - 1,
             Ticks<MillisecondsDouble>(time_4 - time_2),
             nInputs <= 1 ? 0 : Ticks<MillisecondsDouble>(time_4 - time_2) / (nInputs - 1),
             Ticks<SecondsDouble>(m_chainman.time_verify),
             Ticks<MillisecondsDouble>(m_chainman.time_verify) / m_chainman.num_blocks_total);

    if (fJustCheck)
        return true;

    if (!m_blockman.WriteUndoDataForBlock(blockundo, state, *pindex)) {
        return false;
    }

    const auto time_5{SteadyClock::now()};
    m_chainman.time_undo += time_5 - time_4;
    LogDebug(BCLog::BENCH, "    - Write undo data: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_5 - time_4),
             Ticks<SecondsDouble>(m_chainman.time_undo),
             Ticks<MillisecondsDouble>(m_chainman.time_undo) / m_chainman.num_blocks_total);

    if (!pindex->IsValid(BLOCK_VALID_SCRIPTS)) {
        pindex->RaiseValidity(BLOCK_VALID_SCRIPTS);
        m_blockman.m_dirty_blockindex.insert(pindex);
    }

    // add this block to the view's block chain
    view.SetBestBlock(pindex->GetBlockHash());

    const auto time_6{SteadyClock::now()};
    m_chainman.time_index += time_6 - time_5;
    LogDebug(BCLog::BENCH, "    - Index writing: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_6 - time_5),
             Ticks<SecondsDouble>(m_chainman.time_index),
             Ticks<MillisecondsDouble>(m_chainman.time_index) / m_chainman.num_blocks_total);

    TRACE6(validation, block_connected,
        block_hash.data(),
        pindex->nHeight,
        block.vtx.size(),
        nInputs,
        nSigOpsCost,
        time_5 - time_start // in microseconds (µs)
    );

    return true;
}